

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_string_tests.cpp
# Opt level: O0

void util_string_tests::FailFmtWithError<0u>(string_view wrong_fmt,string_view error)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  ErrType *ex;
  anon_class_16_1_a7dec128 check_throw;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[42],_const_char_(&)[42]>
  *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  assertion_result *in_stack_fffffffffffffe78;
  const_string *in_stack_fffffffffffffe90;
  const_string *in_stack_fffffffffffffe98;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffea8;
  string_view in_stack_fffffffffffffed0;
  const_string local_d0;
  lazy_ostream local_c0 [2];
  assertion_result local_a0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
               (pointer)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               (unsigned_long)in_stack_fffffffffffffe68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffea8,file,(size_t)in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe90);
    util::ConstevalFormatString<0U>::Detail_CheckNumFormatSpecifiers(in_stack_fffffffffffffed0);
    do {
      in_stack_fffffffffffffe98 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
                 (pointer)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                 (unsigned_long)in_stack_fffffffffffffe68);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe68);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffffea8,file,(size_t)in_stack_fffffffffffffe98,
                 in_stack_fffffffffffffe90);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffe78,(bool)in_stack_fffffffffffffe77);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                 (char (*) [42])in_stack_fffffffffffffe68);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
                 (pointer)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                 (unsigned_long)in_stack_fffffffffffffe68);
      in_stack_fffffffffffffe68 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[42],_const_char_(&)[42]> *)0x0;
      boost::test_tools::tt_detail::report_assertion(&local_a0,local_c0,&local_d0,0x1a,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[42],_const_char_(&)[42]>::
      ~lazy_ostream_impl(in_stack_fffffffffffffe68);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffe68);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void FailFmtWithError(std::string_view wrong_fmt, std::string_view error)
{
    using ErrType = const char*;
    auto check_throw{[error](const ErrType& str) { return str == error; }};
    BOOST_CHECK_EXCEPTION(util::ConstevalFormatString<WrongNumArgs>::Detail_CheckNumFormatSpecifiers(wrong_fmt), ErrType, check_throw);
}